

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitTypeTraitExpression(SyntaxDumper *this,TypeTraitExpressionSyntax *node)

{
  TypeTraitExpressionSyntax local_50 [56];
  
  traverseExpression(this,(ExpressionSyntax *)node);
  TypeTraitExpressionSyntax::operatorToken(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(node + 0x30));
  return Skip;
}

Assistant:

virtual Action visitTypeTraitExpression(const TypeTraitExpressionSyntax* node) override
    {
        traverseExpression(node);
        terminal(node->operatorToken(), node);
        nonterminal(node->tyReference());
        return Action::Skip;
    }